

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O2

void __thiscall
MissingDependencyScannerTest::MissingDependencyScannerTest(MissingDependencyScannerTest *this)

{
  Test *this_00;
  bool bVar1;
  allocator<char> local_89;
  string err;
  string local_50;
  
  (this->super_Test).failed_ = false;
  (this->super_Test).assertion_failures_ = 0;
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MissingDependencyScannerTest_001e5ac0;
  (this->delegate_).super_MissingDependencyScannerDelegate._vptr_MissingDependencyScannerDelegate =
       (_func_int **)&PTR__MissingDependencyScannerDelegate_001e5af8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"generator_rule",(allocator<char> *)&local_50);
  Rule::Rule(&this->generator_rule_,&err);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"compile_rule",(allocator<char> *)&local_50);
  Rule::Rule(&this->compile_rule_,&err);
  std::__cxx11::string::~string((string *)&err);
  (this->deps_log_).needs_recompaction_ = false;
  (this->deps_log_).file_ = (FILE *)0x0;
  (this->deps_log_).file_path_._M_dataplus._M_p = (pointer)&(this->deps_log_).file_path_.field_2;
  (this->deps_log_).file_path_._M_string_length = 0;
  (this->deps_log_).file_path_.field_2._M_local_buf[0] = '\0';
  (this->deps_log_).nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deps_log_).nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->deps_log_).nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->deps_log_).deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deps_log_).deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->deps_log_).deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  State::State(&this->state_);
  VirtualFileSystem::VirtualFileSystem(&this->filesystem_);
  MissingDependencyScanner::MissingDependencyScanner
            (&this->scanner_,&(this->delegate_).super_MissingDependencyScannerDelegate,
             &this->deps_log_,&this->state_,&(this->filesystem_).super_DiskInterface);
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"MissingDepTest-tempdepslog",&local_89);
  DepsLog::OpenForWrite(&this->deps_log_,&local_50,&err);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = g_current_test;
  bVar1 = std::operator==("",&err);
  bVar1 = testing::Test::Check
                    (this_00,bVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                     ,0x24,"\"\" == err");
  if (!bVar1) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&err);
  return;
}

Assistant:

MissingDependencyScannerTest()
      : generator_rule_("generator_rule"), compile_rule_("compile_rule"),
        scanner_(&delegate_, &deps_log_, &state_, &filesystem_) {
    std::string err;
    deps_log_.OpenForWrite(kTestDepsLogFilename, &err);
    ASSERT_EQ("", err);
  }